

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  cmGeneratedFileStream *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,NINJA_RULES_FILE,&local_39)
  ;
  bVar3 = OpenFileStream(this,&this->RulesFileStream,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pcVar1 = (this->RulesFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,
               "# This file contains all the rules used to get the outputs files\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,"# built from the input files.\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,"# It is included in the main \'",0x1e);
    pcVar2 = NINJA_BUILD_FILE;
    if (NINJA_BUILD_FILE == (char *)0x0) {
      std::ios::clear((int)pcVar1 +
                      (int)(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                           [0xfffffffffffffffd]);
    }
    else {
      sVar4 = strlen(NINJA_BUILD_FILE);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar1,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar1,"\'.\n\n",4);
  }
  return bVar3;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  if (!this->OpenFileStream(this->RulesFileStream,
                            cmGlobalNinjaGenerator::NINJA_RULES_FILE)) {
    return false;
  }

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
  return true;
}